

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

RefNode * __thiscall RefTable::Add(RefTable *this,SQHash mainpos,SQObject *obj)

{
  RefNode *this_00;
  RefNode *pRVar1;
  
  this_00 = this->_freelist;
  pRVar1 = this->_buckets[mainpos];
  SQObjectPtr::operator=(&this_00->obj,obj);
  this->_buckets[mainpos] = this_00;
  this->_freelist = this->_freelist->next;
  this_00->next = pRVar1;
  if (this_00->refs == 0) {
    this->_slotused = this->_slotused + 1;
    return this_00;
  }
  __assert_fail("newnode->refs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                ,500,"RefTable::RefNode *RefTable::Add(SQHash, SQObject &)");
}

Assistant:

RefTable::RefNode *RefTable::Add(SQHash mainpos,SQObject &obj)
{
    RefNode *t = _buckets[mainpos];
    RefNode *newnode = _freelist;
    newnode->obj = obj;
    _buckets[mainpos] = newnode;
    _freelist = _freelist->next;
    newnode->next = t;
    assert(newnode->refs == 0);
    _slotused++;
    return newnode;
}